

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O0

void initialize_patch(pfdistances_patched *distances,loc grid,player *p,_Bool only_known,
                     _Bool forbid_traps)

{
  loc_conflict grid_00;
  loc grid_01;
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  int *piVar4;
  int iVar5;
  _Bool local_4d;
  wchar_t local_4c;
  wchar_t wStack_48;
  loc cursor;
  loc corner;
  wchar_t i;
  wchar_t patchx;
  wchar_t patchy;
  int *block;
  _Bool forbid_traps_local;
  _Bool only_known_local;
  player *p_local;
  pfdistances_patched *distances_local;
  loc grid_local;
  
  distances_local._4_4_ = grid.y;
  if (((((long)grid < 0) || (distances->height <= distances_local._4_4_)) ||
      (distances_local._0_4_ = grid.x, (wchar_t)distances_local < L'\0')) ||
     (distances->width <= (wchar_t)distances_local)) {
    __assert_fail("grid.y >= 0 && grid.y < distances->height && grid.x >= 0 && grid.x < distances->width"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                  ,0x2cb,
                  "void initialize_patch(struct pfdistances_patched *, struct loc, struct player *, _Bool, _Bool)"
                 );
  }
  wVar2 = distances_local._4_4_ >> ((byte)distances->patch_shift & 0x1f);
  if ((wVar2 < L'\0') || (distances->npatchy <= wVar2)) {
    __assert_fail("patchy >= 0 && patchy < distances->npatchy",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                  ,0x2cd,
                  "void initialize_patch(struct pfdistances_patched *, struct loc, struct player *, _Bool, _Bool)"
                 );
  }
  wVar3 = (wchar_t)distances_local >> ((byte)distances->patch_shift & 0x1f);
  if ((L'\xffffffff' < wVar3) && (wVar3 < distances->npatchx)) {
    if (distances->patches[wVar2][wVar3] != (int *)0x0) {
      __assert_fail("!distances->patches[patchy][patchx]",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                    ,0x2d0,
                    "void initialize_patch(struct pfdistances_patched *, struct loc, struct player *, _Bool, _Bool)"
                   );
    }
    piVar4 = (int *)mem_alloc((long)(distances->patch_size * distances->patch_size) << 2);
    distances->patches[wVar2][wVar3] = piVar4;
    wVar3 = wVar3 << ((byte)distances->patch_shift & 0x1f);
    corner.x = 0;
    wVar2 = wVar2 << ((byte)distances->patch_shift & 0x1f);
    for (wStack_48 = wVar2; local_4c = wVar3, wStack_48 < wVar2 + distances->patch_size;
        wStack_48 = wStack_48 + L'\x01') {
      for (; local_4c < wVar3 + distances->patch_size; local_4c = local_4c + L'\x01') {
        grid_00.y = wStack_48;
        grid_00.x = local_4c;
        _Var1 = square_in_bounds_fully((chunk *)p->cave,grid_00);
        local_4d = false;
        if (_Var1) {
          grid_01.y = wStack_48;
          grid_01.x = local_4c;
          local_4d = is_valid_pf(p,grid_01,only_known,forbid_traps);
        }
        iVar5 = -1;
        if (local_4d != false) {
          iVar5 = 0x7fffffff;
        }
        piVar4[corner.x] = iVar5;
        corner.x = corner.x + 1;
      }
    }
    return;
  }
  __assert_fail("patchx >= 0 && patchx < distances->npatchx",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                ,0x2cf,
                "void initialize_patch(struct pfdistances_patched *, struct loc, struct player *, _Bool, _Bool)"
               );
}

Assistant:

static void initialize_patch(struct pfdistances_patched *distances,
		struct loc grid, struct player *p, bool only_known,
		bool forbid_traps)
{
	int *block;
	int patchy, patchx, i;
	struct loc corner, cursor;

	assert(grid.y >= 0 && grid.y < distances->height
		&& grid.x >= 0 && grid.x < distances->width);
	patchy = grid.y >> distances->patch_shift;
	assert(patchy >= 0 && patchy < distances->npatchy);
	patchx = grid.x >> distances->patch_shift;
	assert(patchx >= 0 && patchx < distances->npatchx);
	assert(!distances->patches[patchy][patchx]);
	block = mem_alloc(distances->patch_size * distances->patch_size
		* sizeof(*block));
	distances->patches[patchy][patchx] = block;

	corner.y = patchy << distances->patch_shift;
	corner.x = patchx << distances->patch_shift;
	for (cursor.y = corner.y, i = 0; cursor.y < corner.y
			+ distances->patch_size; ++cursor.y) {
		for (cursor.x = corner.x; cursor.x < corner.x
				+ distances->patch_size; ++cursor.x, ++i) {
			block[i] = (square_in_bounds_fully(p->cave, cursor)
				&& is_valid_pf(p, cursor, only_known,
				forbid_traps)) ? INT_MAX : -1;
		}
	}
}